

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O3

bool anon_unknown.dwarf_11ad9c3::isSameStructUnion(Type *left,Type *right)

{
  SymbolKind SVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  Scope *pSVar4;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar5;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar6;
  Type *pTVar7;
  Type *pTVar8;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar9;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar10;
  
  pTVar7 = left->canonical;
  if (pTVar7 == (Type *)0x0) {
    slang::ast::Type::resolveCanonical(left);
    pTVar7 = left->canonical;
  }
  pTVar8 = right->canonical;
  if (pTVar8 == (Type *)0x0) {
    slang::ast::Type::resolveCanonical(right);
    pTVar8 = right->canonical;
  }
  SVar1 = (pTVar7->super_Symbol).kind;
  if ((SVar1 == (pTVar8->super_Symbol).kind) &&
     ((SVar1 == PackedUnionType || (SVar1 == PackedStructType)))) {
    pSVar4 = slang::ast::Symbol::scopeOrNull(&pTVar7->super_Symbol);
    sVar9 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>(pSVar4);
    sVar5 = sVar9._M_begin.current;
    pSVar4 = slang::ast::Symbol::scopeOrNull(&pTVar8->super_Symbol);
    sVar10 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>(pSVar4);
    sVar6 = sVar10._M_begin.current;
LAB_0037b83f:
    if (sVar5.current != sVar9._M_end.current.current) {
      if (((sVar6.current == sVar10._M_end.current.current) ||
          (__n = ((sVar5.current)->name)._M_len, __n != ((sVar6.current)->name)._M_len)) ||
         ((__n != 0 &&
          (iVar3 = bcmp(((sVar5.current)->name)._M_str,((sVar6.current)->name)._M_str,__n),
          iVar3 != 0)))) goto LAB_0037b8e0;
      pTVar7 = slang::ast::DeclaredType::getType((DeclaredType *)(sVar5.current + 1));
      pTVar8 = slang::ast::DeclaredType::getType((DeclaredType *)(sVar6.current + 1));
      bVar2 = slang::ast::Type::isMatching(pTVar7,pTVar8);
      if ((!bVar2) && (bVar2 = isSameStructUnion(pTVar7,pTVar8), !bVar2)) goto LAB_0037b8e0;
      do {
        sVar5.current = (sVar5.current)->nextInScope;
        if (sVar5.current == (Symbol *)0x0) {
          sVar5.current = (Symbol *)0x0;
          break;
        }
      } while ((sVar5.current)->kind != Field);
      do {
        sVar6.current = (sVar6.current)->nextInScope;
        if (sVar6.current == (Symbol *)0x0) {
          sVar6.current = (Symbol *)0x0;
          break;
        }
      } while ((sVar6.current)->kind != Field);
      goto LAB_0037b83f;
    }
    bVar2 = sVar6.current == sVar10._M_end.current.current;
  }
  else {
LAB_0037b8e0:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool isSameStructUnion(const Type& left, const Type& right) {
    const Type& lt = left.getCanonicalType();
    const Type& rt = right.getCanonicalType();
    if (lt.kind != rt.kind)
        return false;

    if (lt.kind != SymbolKind::PackedStructType && lt.kind != SymbolKind::PackedUnionType)
        return false;

    auto lr = lt.as<Scope>().membersOfType<FieldSymbol>();
    auto rr = rt.as<Scope>().membersOfType<FieldSymbol>();

    auto lit = lr.begin();
    auto rit = rr.begin();
    while (lit != lr.end()) {
        if (rit == rr.end() || lit->name != rit->name)
            return false;

        auto& lft = lit->getType();
        auto& rft = rit->getType();
        if (!lft.isMatching(rft) && !isSameStructUnion(lft, rft))
            return false;

        ++lit;
        ++rit;
    }
    return rit == rr.end();
}